

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

mg_connection *
mg_connect_client(char *host,int port,int use_ssl,char *error_buffer,size_t error_buffer_size)

{
  char *pcVar1;
  mg_connection *pmVar2;
  mg_init_data local_40;
  mg_client_options local_28;
  
  local_40.callbacks = (mg_callbacks *)0x0;
  local_28.client_cert = (char *)0x0;
  local_28.server_cert = (char *)0x0;
  local_28.host_name = (char *)0x0;
  local_28._12_4_ = 0;
  local_28.port = port;
  pcVar1 = host;
  if (use_ssl == 0) {
    use_ssl = 0;
    pcVar1 = local_28.host_name;
  }
  local_28.host_name = pcVar1;
  local_40.user_data = error_buffer;
  local_40.configuration_options = (char **)error_buffer_size;
  local_28.host = host;
  pmVar2 = mg_connect_client_impl(&local_28,use_ssl,&local_40,(mg_error_data *)error_buffer);
  return pmVar2;
}

Assistant:

mg_connection *
mg_connect_client(const char *host,
                  int port,
                  int use_ssl,
                  char *error_buffer,
                  size_t error_buffer_size)
{
	struct mg_client_options opts;
	struct mg_init_data init;
	struct mg_error_data error;

	memset(&init, 0, sizeof(init));

	memset(&error, 0, sizeof(error));
	error.text_buffer_size = error_buffer_size;
	error.text = error_buffer;

	memset(&opts, 0, sizeof(opts));
	opts.host = host;
	opts.port = port;
	if (use_ssl) {
		opts.host_name = host;
	}

	return mg_connect_client_impl(&opts, use_ssl, &init, &error);
}